

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O3

void __thiscall
duckdb::MetaPipeline::MetaPipeline
          (MetaPipeline *this,Executor *executor_p,PipelineBuildState *state_p,
          optional_ptr<duckdb::PhysicalOperator,_true> sink_p,MetaPipelineType type_p)

{
  (this->super_enable_shared_from_this<duckdb::MetaPipeline>).__weak_this_.internal.
  super___weak_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::MetaPipeline>).__weak_this_.internal.
  super___weak_ptr<duckdb::MetaPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->executor = executor_p;
  this->state = state_p;
  (this->parent).ptr = (Pipeline *)0x0;
  (this->sink).ptr = sink_p.ptr;
  this->type = type_p;
  this->recursive_cte = false;
  (this->pipelines).
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pipelines).
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pipelines).
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pipeline_dependencies)._M_h._M_buckets =
       &(this->pipeline_dependencies)._M_h._M_single_bucket;
  (this->pipeline_dependencies)._M_h._M_bucket_count = 1;
  (this->pipeline_dependencies)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pipeline_dependencies)._M_h._M_element_count = 0;
  (this->pipeline_dependencies)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pipeline_dependencies)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pipeline_dependencies)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->children).
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->next_batch_index = 0;
  (this->finish_pipelines)._M_h._M_buckets = &(this->finish_pipelines)._M_h._M_single_bucket;
  (this->finish_pipelines)._M_h._M_bucket_count = 1;
  (this->finish_pipelines)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->finish_pipelines)._M_h._M_element_count = 0;
  (this->finish_pipelines)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->finish_pipelines)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->finish_pipelines)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->finish_map)._M_h._M_buckets = &(this->finish_map)._M_h._M_single_bucket;
  (this->finish_map)._M_h._M_bucket_count = 1;
  (this->finish_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->finish_map)._M_h._M_element_count = 0;
  (this->finish_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->finish_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->finish_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  CreatePipeline(this);
  return;
}

Assistant:

MetaPipeline::MetaPipeline(Executor &executor_p, PipelineBuildState &state_p, optional_ptr<PhysicalOperator> sink_p,
                           MetaPipelineType type_p)
    : executor(executor_p), state(state_p), sink(sink_p), type(type_p), recursive_cte(false), next_batch_index(0) {
	CreatePipeline();
}